

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1;
  ImplicitTypeSyntax *pIVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImplicitTypeSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImplicitTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImplicitTypeSyntax>(
        node.signing.deepClone(alloc),
        *deepClone(node.dimensions, alloc),
        node.placeholder.deepClone(alloc)
    );
}